

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int compare_patches_internal
              (int me,double eps,int ndim,double *array1,int *lo1,int *hi1,int *dims1,double *array2
              ,int *lo2,int *hi2,int *dims2)

{
  double *pdVar1;
  int iVar2;
  char *pre;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  uint in_EDI;
  int *in_R8;
  int *in_R9;
  int *in_XMM0_Qa;
  long in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  char val [48];
  char msg [48];
  Integer diff_1;
  Integer offset2;
  Integer offset1;
  Integer idx2;
  Integer idx1;
  double *patch2;
  double *patch1;
  double max;
  double diff;
  int subscr2 [7];
  int subscr1 [7];
  int elems;
  int j;
  int i;
  char *post;
  char *in_stack_fffffffffffffe88;
  double local_160;
  double local_150;
  char local_138 [48];
  char local_108 [56];
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  char *local_98;
  char *local_90;
  int local_88 [8];
  int local_68 [9];
  int local_44;
  int local_40;
  int local_3c;
  int *local_38;
  int *local_30;
  int *local_28;
  int local_14;
  int *local_10;
  uint local_8;
  
  local_44 = 1;
  local_c0 = 0;
  local_c8 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  local_8 = in_EDI;
  iVar2 = Index(in_ESI,in_RCX,in_R9);
  local_a0 = in_RDX + (long)iVar2 * 8;
  iVar2 = Index(local_14,in_stack_00000010,in_stack_00000020);
  local_a8 = in_stack_00000008 + (long)iVar2 * 8;
  local_3c = 0;
  while( true ) {
    if (local_14 <= local_3c) {
      local_40 = 0;
      while( true ) {
        if (local_44 <= local_40) {
          return 0;
        }
        iVar2 = Index(local_14,local_68,local_38);
        local_b0 = (long)iVar2;
        iVar2 = Index(local_14,local_88,in_stack_00000020);
        if (local_40 == 0) {
          local_c0 = local_b0;
          local_c8 = (long)iVar2;
        }
        local_b0 = local_b0 - local_c0;
        local_b8 = iVar2 - local_c8;
        local_90 = (char *)(*(double *)(local_a0 + local_b0 * 8) -
                           *(double *)(local_a8 + local_b8 * 8));
        pdVar1 = (double *)(local_a0 + local_b0 * 8);
        if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
          local_150 = *(double *)(local_a0 + local_b0 * 8);
        }
        else {
          local_150 = -*(double *)(local_a0 + local_b0 * 8);
        }
        pdVar1 = (double *)(local_a8 + local_b8 * 8);
        if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
          local_160 = *(double *)(local_a8 + local_b8 * 8);
        }
        else {
          local_160 = -*(double *)(local_a8 + local_b8 * 8);
        }
        if (local_150 < local_160) {
          pdVar1 = (double *)(local_a8 + local_b8 * 8);
          if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
            in_stack_fffffffffffffe88 = *(char **)(local_a8 + local_b8 * 8);
            pre = in_stack_fffffffffffffe88;
          }
          else {
            in_stack_fffffffffffffe88 =
                 (char *)((ulong)*(double *)(local_a8 + local_b8 * 8) ^ 0x8000000000000000);
            pre = in_stack_fffffffffffffe88;
          }
        }
        else {
          pdVar1 = (double *)(local_a0 + local_b0 * 8);
          if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
            pre = *(char **)(local_a0 + local_b0 * 8);
          }
          else {
            pre = (char *)((ulong)*(double *)(local_a0 + local_b0 * 8) ^ 0x8000000000000000);
          }
        }
        iVar2 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        if ((((double)pre == 0.0) && (!NAN((double)pre))) ||
           (local_98 = pre, (double)pre < (double)local_10)) {
          local_98 = (char *)0x3ff0000000000000;
        }
        post = local_90;
        if ((double)local_90 < 0.0) {
          post = (char *)-(double)local_90;
        }
        if ((double)local_10 < (double)post / (double)local_98) break;
        update_subscript(local_14,local_68,local_28,local_30,local_38);
        update_subscript(local_14,local_88,in_stack_00000010,in_stack_00000018,in_stack_00000020);
        local_40 = local_40 + 1;
      }
      sprintf(local_108,"ERROR (proc=%d): a",(ulong)local_8);
      sprintf(local_138,"=%f, ",*(undefined8 *)(local_a0 + local_b0 * 8));
      print_subscript(pre,iVar2,local_10,post);
      sprintf(local_108,"=%f\n",*(undefined8 *)(local_a8 + local_b8 * 8));
      print_subscript(pre,iVar2,local_10,post);
      sleep(1);
      return 1;
    }
    local_d0 = (long)(local_30[local_3c] - local_28[local_3c]);
    if (local_d0 != in_stack_00000018[local_3c] - in_stack_00000010[local_3c]) {
      __assert_fail("diff == (hi2[i]-lo2[i])",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                    ,0xde,
                    "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                   );
    }
    if (local_38[local_3c] <= local_d0) break;
    if (in_stack_00000020[local_3c] <= local_d0) {
      __assert_fail("diff < dims2[i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                    ,0xe0,
                    "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                   );
    }
    local_44 = local_44 * ((local_30[local_3c] - local_28[local_3c]) + 1);
    local_68[local_3c] = local_28[local_3c];
    local_88[local_3c] = in_stack_00000010[local_3c];
    local_3c = local_3c + 1;
  }
  __assert_fail("diff < dims1[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0xdf,
                "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
               );
}

Assistant:

int compare_patches_internal(int me, double eps, int ndim, double *array1, 
                     int lo1[], int hi1[], int dims1[],
             double *array2, int lo2[], int hi2[], 
                     int dims2[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM], subscr2[GA_MAX_DIM];
    double diff,max;
    double *patch1, *patch2;
    Integer idx1, idx2, offset1=0, offset2=0;

        /* compute pointer to first element in patch */ 
    patch1 = array1 +  Index(ndim, lo1, dims1);    
    patch2 = array2 +  Index(ndim, lo2, dims2);    

        /* count # of elements & verify consistency of both patches */
    for(i=0;i<ndim;i++){  
        Integer diff = hi1[i]-lo1[i];
        assert(diff == (hi2[i]-lo2[i]));
        assert(diff < dims1[i]);
        assert(diff < dims2[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
        subscr2[i]=lo2[i];
    }

    /* compare element values in both patches */ 
    for(j=0; j< elems; j++){ 
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    
        idx2 = Index(ndim, subscr2, dims2);

        if(j==0){
            offset1 =idx1;
            offset2 =idx2;
        }
        idx1 -= offset1;
        idx2 -= offset2;

                diff = patch1[idx1] - patch2[idx2];
                max  = GA_MAX(GA_ABS(patch1[idx1]),GA_ABS(patch2[idx2]));
                if(max == 0. || max <eps) max = 1.; 

        if(eps < GA_ABS(diff)/max){
            char msg[48], val[48];
            sprintf(msg,"ERROR (proc=%d): a",me);
            sprintf(val,"=%f, ",patch1[idx1]);
            print_subscript(msg,ndim,subscr1,val);
            sprintf(msg,"=%f\n",patch2[idx2]);
            print_subscript(" b",ndim,subscr2,msg);
                        sleep(1);
                        return(1);
        }

        { /* update subscript for the patches */
           update_subscript(ndim, subscr1, lo1,hi1, dims1);
           update_subscript(ndim, subscr2, lo2,hi2, dims2);
        }
    }

        return(0);
}